

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O0

void test_exhaustive_addition(secp256k1_ge *group,secp256k1_gej *groupj)

{
  int iVar1;
  long in_RSI;
  secp256k1_gej tmpj;
  secp256k1_ge tmp_2;
  secp256k1_gej tmp_1;
  secp256k1_gej tmp;
  secp256k1_ge zless_gej;
  secp256k1_fe fe_inv;
  uint64_t iter;
  int j;
  int i;
  secp256k1_gej *in_stack_fffffffffffffd18;
  secp256k1_gej *in_stack_fffffffffffffd20;
  secp256k1_gej *in_stack_fffffffffffffda8;
  secp256k1_gej *in_stack_fffffffffffffdb0;
  secp256k1_gej *in_stack_fffffffffffffe08;
  secp256k1_ge *in_stack_fffffffffffffe10;
  secp256k1_fe *in_stack_fffffffffffffef8;
  secp256k1_ge *in_stack_ffffffffffffff00;
  secp256k1_gej *in_stack_ffffffffffffff08;
  secp256k1_gej *in_stack_ffffffffffffff10;
  secp256k1_fe *in_stack_ffffffffffffff28;
  secp256k1_gej *in_stack_ffffffffffffff30;
  secp256k1_gej *in_stack_ffffffffffffff38;
  secp256k1_gej *in_stack_ffffffffffffff40;
  undefined1 local_b8 [48];
  undefined1 auStack_88 [16];
  secp256k1_fe *in_stack_ffffffffffffff88;
  secp256k1_ge *in_stack_ffffffffffffff90;
  secp256k1_gej *in_stack_ffffffffffffff98;
  secp256k1_gej *in_stack_ffffffffffffffa0;
  uint64_t local_20;
  int local_18;
  int local_14;
  long local_10;
  
  local_20 = 0;
  local_10 = in_RSI;
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x10c640);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
            ,0x81,"test condition failed: secp256k1_ge_is_infinity(&group[0])");
    abort();
  }
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x10c698);
  if (iVar1 != 0) {
    local_14 = 1;
    while( true ) {
      if (0xc < local_14) {
        for (local_18 = 0; local_18 < 0xd; local_18 = local_18 + 1) {
          iVar1 = skip_section(&local_20);
          if (iVar1 == 0) {
            secp256k1_fe_inv(&in_stack_fffffffffffffd20->x,&in_stack_fffffffffffffd18->x);
            for (local_14 = 0; local_14 < 0xd; local_14 = local_14 + 1) {
              secp256k1_gej_add_var
                        (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                         in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
              ge_equals_gej(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
              if (0 < local_18) {
                secp256k1_gej_add_ge
                          (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                           in_stack_ffffffffffffff90);
                ge_equals_gej(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
              }
              secp256k1_gej_add_ge_var
                        (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
              ge_equals_gej(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
              memcpy(local_b8,(void *)(local_10 + (long)local_18 * 0x98),0x30);
              memcpy(auStack_88,(void *)(local_10 + (long)local_18 * 0x98 + 0x30),0x30);
              secp256k1_gej_add_zinv_var
                        (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                         in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
              ge_equals_gej(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
            }
          }
        }
        for (local_14 = 0; local_14 < 0xd; local_14 = local_14 + 1) {
          secp256k1_gej_double(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
          ge_equals_gej(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          secp256k1_gej_double_var
                    (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,(secp256k1_fe *)0x10cb85);
          ge_equals_gej(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        }
        for (local_14 = 1; local_14 < 0xd; local_14 = local_14 + 1) {
          secp256k1_ge_neg((secp256k1_ge *)in_stack_fffffffffffffd20,
                           (secp256k1_ge *)in_stack_fffffffffffffd18);
          ge_equals_ge((secp256k1_ge *)in_stack_fffffffffffffd20,
                       (secp256k1_ge *)in_stack_fffffffffffffd18);
          secp256k1_gej_neg(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
          ge_equals_gej(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        }
        return;
      }
      iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x10c718);
      if (iVar1 != 0) break;
      iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x10c784);
      if (iVar1 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
                ,0x85,"test condition failed: !secp256k1_gej_is_infinity(&groupj[i])");
        abort();
      }
      local_14 = local_14 + 1;
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
            ,0x84,"test condition failed: !secp256k1_ge_is_infinity(&group[i])");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
          ,0x82,"test condition failed: secp256k1_gej_is_infinity(&groupj[0])");
  abort();
}

Assistant:

static void test_exhaustive_addition(const secp256k1_ge *group, const secp256k1_gej *groupj) {
    int i, j;
    uint64_t iter = 0;

    /* Sanity-check (and check infinity functions) */
    CHECK(secp256k1_ge_is_infinity(&group[0]));
    CHECK(secp256k1_gej_is_infinity(&groupj[0]));
    for (i = 1; i < EXHAUSTIVE_TEST_ORDER; i++) {
        CHECK(!secp256k1_ge_is_infinity(&group[i]));
        CHECK(!secp256k1_gej_is_infinity(&groupj[i]));
    }

    /* Check all addition formulae */
    for (j = 0; j < EXHAUSTIVE_TEST_ORDER; j++) {
        secp256k1_fe fe_inv;
        if (skip_section(&iter)) continue;
        secp256k1_fe_inv(&fe_inv, &groupj[j].z);
        for (i = 0; i < EXHAUSTIVE_TEST_ORDER; i++) {
            secp256k1_ge zless_gej;
            secp256k1_gej tmp;
            /* add_var */
            secp256k1_gej_add_var(&tmp, &groupj[i], &groupj[j], NULL);
            ge_equals_gej(&group[(i + j) % EXHAUSTIVE_TEST_ORDER], &tmp);
            /* add_ge */
            if (j > 0) {
                secp256k1_gej_add_ge(&tmp, &groupj[i], &group[j]);
                ge_equals_gej(&group[(i + j) % EXHAUSTIVE_TEST_ORDER], &tmp);
            }
            /* add_ge_var */
            secp256k1_gej_add_ge_var(&tmp, &groupj[i], &group[j], NULL);
            ge_equals_gej(&group[(i + j) % EXHAUSTIVE_TEST_ORDER], &tmp);
            /* add_zinv_var */
            zless_gej.infinity = groupj[j].infinity;
            zless_gej.x = groupj[j].x;
            zless_gej.y = groupj[j].y;
            secp256k1_gej_add_zinv_var(&tmp, &groupj[i], &zless_gej, &fe_inv);
            ge_equals_gej(&group[(i + j) % EXHAUSTIVE_TEST_ORDER], &tmp);
        }
    }

    /* Check doubling */
    for (i = 0; i < EXHAUSTIVE_TEST_ORDER; i++) {
        secp256k1_gej tmp;
        secp256k1_gej_double(&tmp, &groupj[i]);
        ge_equals_gej(&group[(2 * i) % EXHAUSTIVE_TEST_ORDER], &tmp);
        secp256k1_gej_double_var(&tmp, &groupj[i], NULL);
        ge_equals_gej(&group[(2 * i) % EXHAUSTIVE_TEST_ORDER], &tmp);
    }

    /* Check negation */
    for (i = 1; i < EXHAUSTIVE_TEST_ORDER; i++) {
        secp256k1_ge tmp;
        secp256k1_gej tmpj;
        secp256k1_ge_neg(&tmp, &group[i]);
        ge_equals_ge(&group[EXHAUSTIVE_TEST_ORDER - i], &tmp);
        secp256k1_gej_neg(&tmpj, &groupj[i]);
        ge_equals_gej(&group[EXHAUSTIVE_TEST_ORDER - i], &tmpj);
    }
}